

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void * vmd_stack_push(vmd_stack_t *set,void *data)

{
  vmd_stack_block_t *pvVar1;
  void *pvVar2;
  int iVar3;
  vmd_stack_block_t *pvVar4;
  size_t __n;
  
  pvVar4 = set->head;
  if ((pvVar4 == (vmd_stack_block_t *)0x0) || (iVar3 = pvVar4->used, iVar3 == 0x400)) {
    __n = set->dsize;
    pvVar1 = (vmd_stack_block_t *)malloc(__n << 10 | 0x10);
    pvVar1->next = pvVar4;
    pvVar1->used = 0;
    set->head = pvVar1;
    iVar3 = 0;
    pvVar4 = pvVar1;
  }
  else {
    __n = set->dsize;
  }
  pvVar4->used = iVar3 + 1;
  if (data != (void *)0x0) {
    pvVar2 = memcpy(&pvVar4->field_0xc + (long)iVar3 * __n,data,__n);
    return pvVar2;
  }
  return &pvVar4->field_0xc + (long)iVar3 * __n;
}

Assistant:

void *
stack_push(stack_t *set, const void *data)
{
	if (set->head == NULL || set->head->used == BLOCK_SIZE) {
		stack_block_t *head = malloc(sizeof(stack_block_t) + set->dsize * BLOCK_SIZE);

		head->next = set->head;
		head->used = 0;

		set->head = head;
	}

	void *ret = set->head->data + (set->head->used++) * set->dsize;
	if (data)
		memcpy(ret, data, set->dsize);
	return ret;
}